

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_tvptr(ASMState *as,Reg dest,IRRef ref,MSize mode)

{
  IRIns *ir;
  MCode *pMVar1;
  byte bVar2;
  uint uVar3;
  Reg RVar4;
  x86Op xVar5;
  bool bVar6;
  TValue k;
  TValue local_30;
  
  if ((mode & 1) != 0) {
    ir = as->ir + ref;
    if (((ir->field_1).t.irt & 0x1f) == 0xe) {
      if (ref < 0x8000 && (mode & 2) == 0) {
        emit_loadu64(as,dest,(uint64_t)(ir + 1));
        return;
      }
      RVar4 = (Reg)(char)(ir->field_1).r;
      if ((char)(ir->field_1).r < '\0') {
        RVar4 = ra_allocref(as,ref,0xffff0000);
      }
      bVar2 = (byte)RVar4 & 0x1f;
      as->weakset = as->weakset & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
      xVar5 = XO_MOVSDto;
    }
    else if (ref < 0x8000) {
      lj_ir_kvalue(as->J->L,&local_30,ir);
      pMVar1 = as->mcp;
      *(uint32_t *)(pMVar1 + -4) = local_30.field_4.it;
      as->mcp = pMVar1 + -4;
      emit_rmro(as,XO_MOVmi,0,dest,4);
      pMVar1 = as->mcp;
      *(int32_t *)(pMVar1 + -4) = local_30.field_4.i;
      as->mcp = pMVar1 + -4;
      xVar5 = XO_MOVmi;
      RVar4 = 0;
    }
    else {
      RVar4 = (Reg)(char)(ir->field_1).r;
      if ((char)(ir->field_1).r < '\0') {
        RVar4 = ra_allocref(as,ref,~(1 << (dest & 0x1f)) & 0xbfef);
      }
      bVar2 = (byte)RVar4 & 0x1f;
      as->weakset = as->weakset & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
      uVar3 = (ir->field_1).t.irt & 0x1f;
      pMVar1 = as->mcp;
      bVar6 = (0x605fd9U >> uVar3 & 1) != 0;
      *(uint *)(pMVar1 + -4) = ~uVar3 << 0xf;
      as->mcp = pMVar1 + -4;
      if (bVar6) {
        xVar5 = XO_ARITHi;
      }
      else {
        xVar5 = XO_MOVmi;
      }
      emit_rmro(as,xVar5,(uint)bVar6,dest,4);
      uVar3._0_2_ = *(IROpT *)((long)ir + 4);
      uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
      RVar4 = -(uint)((0x605fd9U >> (uVar3 & 0x1f) & 1) != 0) & 0x80200 | RVar4;
      xVar5 = XO_MOVto;
    }
    emit_rmro(as,xVar5,RVar4,dest,0);
  }
  emit_loadu64(as,dest,(uint64_t)&as->J[-1].penalty[0x31].val);
  return;
}

Assistant:

static void asm_tvptr(ASMState *as, Reg dest, IRRef ref, MSize mode)
{
  if ((mode & IRTMPREF_IN1)) {
    IRIns *ir = IR(ref);
    if (irt_isnum(ir->t)) {
      if (irref_isk(ref) && !(mode & IRTMPREF_OUT1)) {
	/* Use the number constant itself as a TValue. */
	emit_loada(as, dest, ir_knum(ir));
	return;
      }
      emit_rmro(as, XO_MOVSDto, ra_alloc1(as, ref, RSET_FPR), dest, 0);
    } else {
#if LJ_GC64
      if (irref_isk(ref)) {
	TValue k;
	lj_ir_kvalue(as->J->L, &k, ir);
	emit_movmroi(as, dest, 4, k.u32.hi);
	emit_movmroi(as, dest, 0, k.u32.lo);
      } else {
	/* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
	if (irt_is64(ir->t)) {
	  emit_u32(as, irt_toitype(ir->t) << 15);
	  emit_rmro(as, XO_ARITHi, XOg_OR, dest, 4);
	} else {
	  emit_movmroi(as, dest, 4, (irt_toitype(ir->t) << 15));
	}
	emit_movtomro(as, REX_64IR(ir, src), dest, 0);
      }
#else
      if (!irref_isk(ref)) {
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
	emit_movtomro(as, REX_64IR(ir, src), dest, 0);
      } else if (!irt_ispri(ir->t)) {
	emit_movmroi(as, dest, 0, ir->i);
      }
      if (!(LJ_64 && irt_islightud(ir->t)))
	emit_movmroi(as, dest, 4, irt_toitype(ir->t));
#endif
    }
  }
  emit_loada(as, dest, &J2G(as->J)->tmptv); /* g->tmptv holds the TValue(s). */
}